

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptSet.cpp
# Opt level: O1

void __thiscall Js::JavascriptSet::PromoteToComplexVarSet(JavascriptSet *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  Type TVar5;
  int iVar6;
  undefined8 *puVar7;
  
  if (this->kind != SimpleVarSet) {
    if (this->kind == IntSet) {
      iVar6 = 0;
      for (puVar7 = *(undefined8 **)this->u; puVar7 != (undefined8 *)0x0;
          puVar7 = (undefined8 *)*puVar7) {
        BVar3 = BVUnitT<unsigned_long>::CountBit(puVar7[2]);
        iVar6 = iVar6 + BVar3;
      }
      goto LAB_00d1be92;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptSet.cpp"
                                ,0x132,"(this->kind == SetKind::SimpleVarSet)",
                                "this->kind == SetKind::SimpleVarSet");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  iVar6 = *(int *)((this->u).field3 + 0x20) - *(int *)((this->u).field3 + 0x28);
LAB_00d1be92:
  TVar5 = (Type)CreateVarSetFromList<JsUtil::BaseDictionary<void*,Js::MapOrSetDataNode<void*>*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::SameValueZeroComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>>
                          (this,iVar6 + 1);
  this->kind = ComplexVarSet;
  Memory::Recycler::WBSetBit((char *)&(this->u).simpleVarSet);
  this->u = TVar5;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->u);
  return;
}

Assistant:

void
JavascriptSet::PromoteToComplexVarSet()
{
    uint setSize = 0;
    if (this->kind == SetKind::IntSet)
    {
        setSize = this->u.intSet->Count();
    }
    else
    {
        AssertOrFailFast(this->kind == SetKind::SimpleVarSet);
        setSize = this->u.simpleVarSet->Count();
    }
    ComplexVarDataSet* newSet = this->CreateVarSetFromList<ComplexVarDataSet>(setSize + 1);

    this->kind = SetKind::ComplexVarSet;
    this->u.complexVarSet = newSet;
}